

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.h
# Opt level: O0

string * __thiscall
absl::lts_20250127::
StrCat<std::basic_string_view<char,std::char_traits<char>>,char[23],std::basic_string_view<char,std::char_traits<char>>,char[4],std::__cxx11::string,char[45]>
          (string *__return_storage_ptr__,lts_20250127 *this,AlphaNum *a,AlphaNum *b,AlphaNum *c,
          AlphaNum *d,AlphaNum *e,basic_string_view<char,_std::char_traits<char>_> *args,
          char (*args_1) [23],basic_string_view<char,_std::char_traits<char>_> *args_2,
          char (*args_3) [4],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4,
          char (*args_5) [45])

{
  size_type sVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  AlphaNum local_238;
  AlphaNum local_208;
  AlphaNum local_1d8;
  size_type local_1a8;
  undefined8 local_1a0;
  AlphaNum local_198;
  AlphaNum local_168;
  size_t local_138;
  char *local_130;
  AlphaNum local_128;
  string_view local_f8;
  string_view local_e8;
  string_view local_d8;
  string_view local_c8;
  string_view local_b8;
  string_view local_a8;
  string_view local_98;
  string_view local_88;
  string_view local_78;
  string_view local_68;
  string_view local_58;
  string_view *local_48;
  undefined8 local_40;
  AlphaNum *local_38;
  AlphaNum *e_local;
  AlphaNum *d_local;
  AlphaNum *c_local;
  AlphaNum *b_local;
  AlphaNum *a_local;
  
  local_38 = d;
  e_local = c;
  d_local = b;
  c_local = a;
  b_local = (AlphaNum *)this;
  a_local = (AlphaNum *)__return_storage_ptr__;
  local_f8 = AlphaNum::Piece((AlphaNum *)this);
  local_e8 = AlphaNum::Piece(c_local);
  local_d8 = AlphaNum::Piece(d_local);
  local_c8 = AlphaNum::Piece(e_local);
  local_b8 = AlphaNum::Piece(local_38);
  local_138 = (e->piece_)._M_len;
  local_130 = (e->piece_)._M_str;
  AlphaNum::AlphaNum(&local_128,e->piece_);
  local_a8 = AlphaNum::Piece(&local_128);
  AlphaNum::AlphaNum(&local_168,(Nullable<const_char_*>)args);
  local_98 = AlphaNum::Piece(&local_168);
  sVar1 = *(size_type *)*args_1;
  local_1a0 = *(undefined8 *)(*args_1 + 8);
  local_1a8 = sVar1;
  AlphaNum::AlphaNum(&local_198,*(string_view *)*args_1);
  local_88 = AlphaNum::Piece(&local_198);
  AlphaNum::AlphaNum(&local_1d8,(Nullable<const_char_*>)args_2);
  local_78 = AlphaNum::Piece(&local_1d8);
  AlphaNum::AlphaNum<std::allocator<char>>
            (&local_208,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_3)
  ;
  local_68 = AlphaNum::Piece(&local_208);
  AlphaNum::AlphaNum(&local_238,(Nullable<const_char_*>)args_4);
  local_58 = AlphaNum::Piece(&local_238);
  local_48 = &local_f8;
  local_40 = 0xb;
  pieces._M_len = sVar1;
  pieces._M_array = (iterator)0xb;
  strings_internal::CatPieces_abi_cxx11_(__return_storage_ptr__,(strings_internal *)local_48,pieces)
  ;
  return __return_storage_ptr__;
}

Assistant:

ABSL_MUST_USE_RESULT inline std::string StrCat(
    const AlphaNum& a, const AlphaNum& b, const AlphaNum& c, const AlphaNum& d,
    const AlphaNum& e, const AV&... args) {
  return strings_internal::CatPieces(
      {a.Piece(), b.Piece(), c.Piece(), d.Piece(), e.Piece(),
       static_cast<const AlphaNum&>(args).Piece()...});
}